

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::removeSatisfiedClause(Solver *this,CRef cr,bool remove_from_proof)

{
  int iVar1;
  CRef CVar2;
  lbool *plVar3;
  ulong *puVar4;
  ulong uVar5;
  int iVar6;
  vec<Minisat::Lit> unitClause;
  Lit unit;
  vec<Minisat::Lit> local_38;
  Lit local_24;
  
  if (this->drup_file != (FILE *)0x0) {
    puVar4 = (ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + cr);
    if ((uint)(*puVar4 >> 0x22) == 2) {
      uVar5 = (ulong)((this->assigns).data[(int)puVar4[1] >> 1].value != ((byte)(int)puVar4[1] & 1))
      ;
    }
    else {
      uVar5 = 0;
    }
    iVar1 = *(int *)((long)puVar4 + uVar5 * 4 + 8);
    iVar6 = iVar1 >> 1;
    plVar3 = (this->assigns).data;
    if ((plVar3[iVar6].value == ((byte)iVar1 & 1)) &&
       (CVar2 = (this->vardata).data[iVar6].reason, CVar2 == cr && CVar2 != 0xffffffff)) {
      if ((*puVar4 & 0xfffffffc00000000) == 0x800000000) {
        iVar1 = (int)puVar4[1];
        uVar5 = (ulong)(plVar3[iVar1 >> 1].value != ((byte)iVar1 & 1));
      }
      else {
        uVar5 = 0;
      }
      local_24.x = *(int *)((long)(puVar4 + 1) + uVar5 * 4);
      local_38.data = (Lit *)0x0;
      local_38.sz = 0;
      local_38.cap = 0;
      vec<Minisat::Lit>::push(&local_38,&local_24);
      binDRUP<Minisat::vec<Minisat::Lit>>(this,'a',&local_38,this->drup_file);
      if (local_38.data != (Lit *)0x0) {
        local_38._8_8_ = local_38._8_8_ & 0xffffffff00000000;
        free(local_38.data);
        local_38.data = (Lit *)0x0;
        local_38._8_8_ = local_38._8_8_ & 0xffffffff;
      }
    }
  }
  removeClause(this,cr,remove_from_proof);
  return;
}

Assistant:

void Solver::removeSatisfiedClause(CRef cr, bool remove_from_proof)
{
    Clause &c = ca[cr];

    if (drup_file && locked(c)) {
        // The following line was copied from Solver::locked.
        int i = c.size() != 2 ? 0 : (value(c[0]) == l_True ? 0 : 1);
        Lit unit = c[i];
#ifdef BIN_DRUP
        vec<Lit> unitClause;
        unitClause.push(unit);
        binDRUP('a', unitClause, drup_file);
#else
        fprintf(drup_file, "%i 0\n", (var(unit) + 1) * (-2 * sign(unit) + 1));
#endif
    }

    removeClause(cr, remove_from_proof);
}